

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

Value * DumpBacktrace(Value *__return_storage_ptr__,cmListFileBacktrace *backtrace)

{
  cmListFileContext *pcVar1;
  Value *pVVar2;
  Value *extraout_RAX;
  cmListFileBacktrace backtraceCopy;
  Value entry;
  cmListFileBacktrace local_110;
  cmListFileBacktrace local_f0;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  cmListFileBacktrace::cmListFileBacktrace(&local_110,backtrace);
  while( true ) {
    pcVar1 = cmListFileBacktrace::Top(&local_110);
    if ((pcVar1->FilePath)._M_string_length == 0) break;
    Json::Value::Value(&local_58,objectValue);
    pcVar1 = cmListFileBacktrace::Top(&local_110);
    Json::Value::Value(&local_80,&pcVar1->FilePath);
    pVVar2 = Json::Value::operator[](&local_58,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_80);
    Json::Value::~Value(&local_80);
    pcVar1 = cmListFileBacktrace::Top(&local_110);
    if (pcVar1->Line != 0) {
      pcVar1 = cmListFileBacktrace::Top(&local_110);
      Json::Value::Value(&local_a8,(Int)pcVar1->Line);
      pVVar2 = Json::Value::operator[](&local_58,&kLINE_NUMBER_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_a8);
      Json::Value::~Value(&local_a8);
    }
    pcVar1 = cmListFileBacktrace::Top(&local_110);
    if ((pcVar1->Name)._M_string_length != 0) {
      pcVar1 = cmListFileBacktrace::Top(&local_110);
      Json::Value::Value(&local_d0,&pcVar1->Name);
      pVVar2 = Json::Value::operator[](&local_58,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar2,&local_d0);
      Json::Value::~Value(&local_d0);
    }
    Json::Value::append(__return_storage_ptr__,&local_58);
    cmListFileBacktrace::Pop(&local_f0,&local_110);
    cmListFileBacktrace::operator=(&local_110,&local_f0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_f0);
    Json::Value::~Value(&local_58);
  }
  cmListFileBacktrace::~cmListFileBacktrace(&local_110);
  return extraout_RAX;
}

Assistant:

static Json::Value DumpBacktrace(const cmListFileBacktrace& backtrace)
{
  Json::Value result = Json::arrayValue;

  cmListFileBacktrace backtraceCopy = backtrace;
  while (!backtraceCopy.Top().FilePath.empty()) {
    Json::Value entry = Json::objectValue;
    entry[kPATH_KEY] = backtraceCopy.Top().FilePath;
    if (backtraceCopy.Top().Line) {
      entry[kLINE_NUMBER_KEY] = (int)backtraceCopy.Top().Line;
    }
    if (!backtraceCopy.Top().Name.empty()) {
      entry[kNAME_KEY] = backtraceCopy.Top().Name;
    }
    result.append(std::move(entry));
    backtraceCopy = backtraceCopy.Pop();
  }
  return result;
}